

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

void __thiscall llvm::APFloat::print(APFloat *this,raw_ostream *OS)

{
  raw_ostream *this_00;
  SmallVector<char,_16U> Buffer;
  
  Buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX =
       &Buffer.super_SmallVectorStorage<char,_16U>;
  Buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = 0;
  Buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity = 0x10;
  toString(this,&Buffer.super_SmallVectorImpl<char>,0,3,true);
  this_00 = raw_ostream::operator<<(OS,&Buffer.super_SmallVectorImpl<char>);
  raw_ostream::operator<<(this_00,"\n");
  SmallVectorImpl<char>::~SmallVectorImpl(&Buffer.super_SmallVectorImpl<char>);
  return;
}

Assistant:

void APFloat::print(raw_ostream &OS) const {
  SmallVector<char, 16> Buffer;
  toString(Buffer);
  OS << Buffer << "\n";
}